

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventhandler.hpp
# Opt level: O0

void __thiscall
Eventhandler<QpModelStatus_&>::fire(Eventhandler<QpModelStatus_&> *this,QpModelStatus *args)

{
  bool bVar1;
  function<void_(QpModelStatus_&)> fun;
  iterator __end0;
  iterator __begin0;
  vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  *__range2;
  vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  *in_stack_ffffffffffffff98;
  function<void_(QpModelStatus_&)> *in_stack_ffffffffffffffa0;
  function<void_(QpModelStatus_&)> *in_stack_ffffffffffffffa8;
  function<void_(QpModelStatus_&)> *in_stack_ffffffffffffffb0;
  function<void_(QpModelStatus_&)> local_48;
  function<void_(QpModelStatus_&)> *local_28;
  __normal_iterator<std::function<void_(QpModelStatus_&)>_*,_std::vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (function<void_(QpModelStatus_&)> *)
       std::
       vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_28 = (function<void_(QpModelStatus_&)> *)
             std::
             vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
             ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::function<void_(QpModelStatus_&)>_*,_std::vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::function<void_(QpModelStatus_&)>_*,_std::vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::function<void_(QpModelStatus_&)>_*,_std::vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>_>
    ::operator*(local_20);
    in_stack_ffffffffffffffa0 = &local_48;
    std::function<void_(QpModelStatus_&)>::function
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::function<void_(QpModelStatus_&)>::operator()
              (in_stack_ffffffffffffffa0,(QpModelStatus *)in_stack_ffffffffffffff98);
    std::function<void_(QpModelStatus_&)>::~function((function<void_(QpModelStatus_&)> *)0x754b12);
    __gnu_cxx::
    __normal_iterator<std::function<void_(QpModelStatus_&)>_*,_std::vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void fire(T args) {
    for (std::function<void(T)> fun : subscribers) {
      fun(args);
    }
  }